

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Table::Table(Table *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_04;
  allocator_type local_539;
  allocator_type local_538;
  allocator<char> local_537;
  allocator<char> local_536;
  allocator<char> local_535;
  allocator<char> local_534;
  allocator<char> local_533;
  allocator<char> local_532;
  allocator<char> local_531;
  allocator_type local_530;
  allocator<char> local_52f;
  allocator<char> local_52e;
  allocator<char> local_52d;
  allocator<char> local_52c;
  allocator<char> local_52b;
  allocator<char> local_52a;
  allocator<char> local_529;
  allocator_type local_528;
  allocator<char> local_527;
  allocator<char> local_526;
  allocator<char> local_525;
  allocator<char> local_524;
  allocator<char> local_523;
  allocator<char> local_522;
  allocator<char> local_521;
  allocator_type local_520;
  allocator<char> local_51f;
  allocator<char> local_51e;
  allocator<char> local_51d;
  allocator<char> local_51c;
  allocator<char> local_51b;
  allocator<char> local_51a;
  allocator<char> local_519;
  allocator_type local_518;
  allocator<char> local_517;
  allocator<char> local_516;
  allocator<char> local_515;
  allocator<char> local_514;
  allocator<char> local_513;
  allocator<char> local_512;
  allocator<char> local_511;
  string *local_510;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  this->score = 0x7fffffff;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_511);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"",&local_512);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"",&local_513);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"",&local_514);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"",&local_515);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"",&local_516);
  local_510 = local_50;
  std::__cxx11::string::string<std::allocator<char>>(local_510,"",&local_517);
  __l._M_len = 7;
  __l._M_array = &local_110;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_508,__l,&local_518);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_519);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"",&local_51a);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"",&local_51b);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"",&local_51c);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"",&local_51d);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"",&local_51e);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"",&local_51f);
  __l_00._M_len = 7;
  __l_00._M_array = &local_1f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_508 + 1,__l_00,&local_520);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"",&local_521);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"",&local_522);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"",&local_523);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"",&local_524);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"",&local_525);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"",&local_526);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"",&local_527);
  __l_01._M_len = 7;
  __l_01._M_array = &local_2d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_508 + 2,__l_01,&local_528);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",&local_529);
  std::__cxx11::string::string<std::allocator<char>>(local_390,"",&local_52a);
  std::__cxx11::string::string<std::allocator<char>>(local_370,"",&local_52b);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"",&local_52c);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"",&local_52d);
  std::__cxx11::string::string<std::allocator<char>>(local_310,"",&local_52e);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"",&local_52f);
  __l_02._M_len = 7;
  __l_02._M_array = &local_3b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_508 + 3,__l_02,&local_530);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"",&local_531);
  std::__cxx11::string::string<std::allocator<char>>(local_470,"",&local_532);
  std::__cxx11::string::string<std::allocator<char>>(local_450,"",&local_533);
  std::__cxx11::string::string<std::allocator<char>>(local_430,"",&local_534);
  std::__cxx11::string::string<std::allocator<char>>(local_410,"",&local_535);
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"",&local_536);
  std::__cxx11::string::string<std::allocator<char>>(local_3d0,"",&local_537);
  __l_03._M_len = 7;
  __l_03._M_array = &local_490;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4a8,__l_03,&local_538);
  __l_04._M_len = 5;
  __l_04._M_array = local_508;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->table,__l_04,&local_539);
  lVar1 = 0x60;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_508[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_490._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_3b0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_2d0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1f0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_110._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

constexpr Table() = default;